

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * tinyusdz::print_typed_terminal_attr<tinyusdz::value::vector3f>
                   (string *__return_storage_ptr__,
                   TypedTerminalAttribute<tinyusdz::value::vector3f> *attr,string *name,
                   uint32_t indent)

{
  bool bVar1;
  string *psVar2;
  ostream *poVar3;
  AttrMeta *pAVar4;
  uint32_t n;
  uint32_t n_00;
  string local_230;
  string local_210;
  string local_1f0 [32];
  string local_1d0;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream aoStack_1a0 [380];
  uint32_t local_24;
  string *psStack_20;
  uint32_t indent_local;
  string *name_local;
  TypedTerminalAttribute<tinyusdz::value::vector3f> *attr_local;
  
  local_24 = indent;
  psStack_20 = name;
  name_local = (string *)attr;
  attr_local = (TypedTerminalAttribute<tinyusdz::value::vector3f> *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b0);
  bVar1 = TypedTerminalAttribute<tinyusdz::value::vector3f>::authored
                    ((TypedTerminalAttribute<tinyusdz::value::vector3f> *)name_local);
  if (bVar1) {
    pprint::Indent_abi_cxx11_(&local_1d0,(pprint *)(ulong)local_24,n);
    std::operator<<(aoStack_1a0,(string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    bVar1 = TypedTerminalAttribute<tinyusdz::value::vector3f>::has_actual_type
                      ((TypedTerminalAttribute<tinyusdz::value::vector3f> *)name_local);
    if (bVar1) {
      psVar2 = TypedTerminalAttribute<tinyusdz::value::vector3f>::get_actual_type_name_abi_cxx11_
                         ((TypedTerminalAttribute<tinyusdz::value::vector3f> *)name_local);
      poVar3 = std::operator<<(aoStack_1a0,(string *)psVar2);
      poVar3 = std::operator<<(poVar3," ");
      std::operator<<(poVar3,(string *)psStack_20);
    }
    else {
      value::TypeTraits<tinyusdz::value::vector3f>::type_name_abi_cxx11_();
      poVar3 = std::operator<<(aoStack_1a0,local_1f0);
      poVar3 = std::operator<<(poVar3," ");
      std::operator<<(poVar3,(string *)psStack_20);
      std::__cxx11::string::~string(local_1f0);
    }
    pAVar4 = TypedTerminalAttribute<tinyusdz::value::vector3f>::metas
                       ((TypedTerminalAttribute<tinyusdz::value::vector3f> *)name_local);
    bVar1 = AttrMetas::authored(pAVar4);
    if (bVar1) {
      poVar3 = std::operator<<(aoStack_1a0," (\n");
      pAVar4 = TypedTerminalAttribute<tinyusdz::value::vector3f>::metas
                         ((TypedTerminalAttribute<tinyusdz::value::vector3f> *)name_local);
      print_attr_metas_abi_cxx11_
                (&local_210,(tinyusdz *)pAVar4,(AttrMeta *)(ulong)(local_24 + 1),indent);
      poVar3 = std::operator<<(poVar3,(string *)&local_210);
      pprint::Indent_abi_cxx11_(&local_230,(pprint *)(ulong)local_24,n_00);
      poVar3 = std::operator<<(poVar3,(string *)&local_230);
      std::operator<<(poVar3,")");
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_210);
    }
    std::operator<<(aoStack_1a0,"\n");
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string print_typed_terminal_attr(const TypedTerminalAttribute<T> &attr,
                                      const std::string &name,
                                      const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {
    ss << pprint::Indent(indent);

    if (attr.has_actual_type()) {
      ss << attr.get_actual_type_name() << " " << name;
    } else {
      ss << value::TypeTraits<T>::type_name() << " " << name;
    }

    if (attr.metas().authored()) {
      ss << " (\n"
         << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
         << ")";
    }
    ss << "\n";
  }

  return ss.str();
}